

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hpp
# Opt level: O3

void __thiscall BCL::error::~error(error *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->what_arg_)._M_dataplus._M_p;
  paVar2 = &(this->what_arg_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

error(const std::string& what_arg) : what_arg_(what_arg) {}